

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Ptr<Catch::TestCaseTracking::ITracker> * __thiscall
Catch::Ptr<Catch::TestCaseTracking::ITracker>::operator=
          (Ptr<Catch::TestCaseTracking::ITracker> *this,ITracker *p)

{
  ITracker *pIVar1;
  
  if (p != (ITracker *)0x0) {
    (*(p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2])(p)
    ;
  }
  pIVar1 = this->m_p;
  this->m_p = p;
  if (pIVar1 != (ITracker *)0x0) {
    (*(pIVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [3])();
  }
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }